

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

void __thiscall CTcCodeStream::add_local_frame(CTcCodeStream *this,CTcPrsSymtab *symtab)

{
  size_t sVar1;
  CTcPrsSymtab **ppCVar2;
  
  if (((symtab != (CTcPrsSymtab *)0x0) && (G_prs->global_symtab_ != symtab)) &&
     (symtab->list_index_ == 0)) {
    symtab->list_next_ = (CTcPrsSymtab *)0x0;
    ppCVar2 = &this->frame_tail_->list_next_;
    if (this->frame_tail_ == (CTcPrsSymtab *)0x0) {
      ppCVar2 = &this->frame_head_;
    }
    *ppCVar2 = symtab;
    this->frame_tail_ = symtab;
    sVar1 = this->frame_cnt_ + 1;
    this->frame_cnt_ = sVar1;
    symtab->list_index_ = (int)sVar1;
    return;
  }
  return;
}

Assistant:

void CTcCodeStream::add_local_frame(CTcPrsSymtab *symtab)
{
    /* 
     *   If this is the global symbol table, or it's null, or it's already
     *   in a list, ignore it.  Note that we can tell if the item is in a
     *   list by checking its index value - a value of zero is never a
     *   valid index and thus indicates that the item isn't in a list yet.
     */
    if (symtab == G_prs->get_global_symtab()
        || symtab == 0
        || symtab->get_list_index() != 0)
        return;
    
    /* link the frame in at the tail of our list */
    symtab->set_list_next(0);
    if (frame_tail_ == 0)
        frame_head_ = symtab;
    else
        frame_tail_->set_list_next(symtab);
    frame_tail_ = symtab;

    /* count the new entry in the list */
    ++frame_cnt_;

    /* 
     *   Set this frame's index in the list.  Note that we've already
     *   incremented the index value, so the first frame in the list will
     *   have index 1, as is required. 
     */
    symtab->set_list_index(frame_cnt_);
}